

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O3

FT_Bool Normalize(FT_F26Dot6 Vx,FT_F26Dot6 Vy,FT_UnitVector *R)

{
  uint uVar1;
  FT_Vector V;
  FT_Vector local_20;
  
  local_20.y = Vy | Vx;
  if (local_20.y != 0) {
    local_20.x = Vx;
    local_20.y = Vy;
    FT_Vector_NormLen(&local_20);
    uVar1 = (uint)local_20.x + 3;
    if (-1 < local_20.x) {
      uVar1 = (uint)local_20.x;
    }
    R->x = (FT_F2Dot14)(uVar1 >> 2);
    uVar1 = (uint)local_20.y + 3;
    if (-1 < local_20.y) {
      uVar1 = (uint)local_20.y;
    }
    R->y = (FT_F2Dot14)(uVar1 >> 2);
  }
  return (FT_Bool)local_20.y;
}

Assistant:

static FT_Bool
  Normalize( FT_F26Dot6      Vx,
             FT_F26Dot6      Vy,
             FT_UnitVector*  R )
  {
    FT_Vector V;


    if ( Vx == 0 && Vy == 0 )
    {
      /* XXX: UNDOCUMENTED! It seems that it is possible to try   */
      /*      to normalize the vector (0,0).  Return immediately. */
      return SUCCESS;
    }

    V.x = Vx;
    V.y = Vy;

    FT_Vector_NormLen( &V );

    R->x = (FT_F2Dot14)( V.x / 4 );
    R->y = (FT_F2Dot14)( V.y / 4 );

    return SUCCESS;
  }